

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosCommDummy.cpp
# Opt level: O0

Win __thiscall
adios2::helper::CommImplDummy::Win_allocate_shared
          (CommImplDummy *this,size_t size,int disp_unit,void *baseptr,string *param_5)

{
  unique_ptr<adios2::helper::CommWinImplDummy,_std::default_delete<adios2::helper::CommWinImplDummy>_>
  *in_RDI;
  unique_ptr<adios2::helper::CommWinImplDummy,_std::default_delete<adios2::helper::CommWinImplDummy>_>
  win;
  unique_ptr<adios2::helper::CommWinImplDummy,_std::default_delete<adios2::helper::CommWinImplDummy>_>
  *in_stack_ffffffffffffff90;
  unique_ptr<adios2::helper::CommWinImpl,_std::default_delete<adios2::helper::CommWinImpl>_>
  *this_00;
  _Head_base<0UL,_adios2::helper::CommWinImpl_*,_false> this_01;
  unique_ptr<adios2::helper::CommWinImpl,_std::default_delete<adios2::helper::CommWinImpl>_>
  local_50;
  unique_ptr<adios2::helper::CommWinImpl,_std::default_delete<adios2::helper::CommWinImpl>_>
  *in_stack_ffffffffffffffb8;
  CommWinImplDummy local_38 [7];
  
  this_01._M_head_impl = (CommWinImpl *)in_RDI;
  operator_new(8);
  CommWinImplDummy::CommWinImplDummy((CommWinImplDummy *)in_stack_ffffffffffffff90);
  std::
  unique_ptr<adios2::helper::CommWinImplDummy,std::default_delete<adios2::helper::CommWinImplDummy>>
  ::unique_ptr<std::default_delete<adios2::helper::CommWinImplDummy>,void>
            (in_stack_ffffffffffffff90,local_38);
  this_00 = &local_50;
  std::unique_ptr<adios2::helper::CommWinImpl,std::default_delete<adios2::helper::CommWinImpl>>::
  unique_ptr<adios2::helper::CommWinImplDummy,std::default_delete<adios2::helper::CommWinImplDummy>,void>
            ((unique_ptr<adios2::helper::CommWinImpl,_std::default_delete<adios2::helper::CommWinImpl>_>
              *)this_01._M_head_impl,in_RDI);
  CommImpl::MakeWin(in_stack_ffffffffffffffb8);
  std::unique_ptr<adios2::helper::CommWinImpl,_std::default_delete<adios2::helper::CommWinImpl>_>::
  ~unique_ptr(this_00);
  std::
  unique_ptr<adios2::helper::CommWinImplDummy,_std::default_delete<adios2::helper::CommWinImplDummy>_>
  ::~unique_ptr((unique_ptr<adios2::helper::CommWinImplDummy,_std::default_delete<adios2::helper::CommWinImplDummy>_>
                 *)this_00);
  return (unique_ptr<adios2::helper::CommWinImpl,_std::default_delete<adios2::helper::CommWinImpl>_>
         )(unique_ptr<adios2::helper::CommWinImpl,_std::default_delete<adios2::helper::CommWinImpl>_>
           )this_01._M_head_impl;
}

Assistant:

Comm::Win CommImplDummy::Win_allocate_shared(size_t size, int disp_unit, void *baseptr,
                                             const std::string &) const
{
    auto win = std::unique_ptr<CommWinImplDummy>(new CommWinImplDummy());
    // TODO: How do you set the out pointer to NULL? baseptr = nullptr;
    return MakeWin(std::move(win));
}